

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O2

XrResult GenValidUsageInputsXrDestroyPlaneDetectorEXT(XrPlaneDetectorEXT planeDetector)

{
  ValidateXrHandleResult VVar1;
  XrResult XVar2;
  XrPlaneDetectorEXT_T *in_stack_fffffffffffffdd8;
  XrPlaneDetectorEXT planeDetector_local;
  string local_218;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> objects_info;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1d8;
  string local_1c0;
  string local_1a0;
  ostringstream oss;
  
  objects_info.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  objects_info.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  objects_info.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  _oss = 0x3ba155c8;
  planeDetector_local = planeDetector;
  std::vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>>::
  emplace_back<XrPlaneDetectorEXT_T*&,XrObjectType>
            ((vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>> *)
             &objects_info,&planeDetector_local,(XrObjectType *)&oss);
  VVar1 = VerifyXrPlaneDetectorEXTHandle(&planeDetector_local);
  if (VVar1 == VALIDATE_XR_HANDLE_SUCCESS) {
    XVar2 = XR_SUCCESS;
    HandleInfo<XrPlaneDetectorEXT_T_*>::getWithInstanceInfo
              (&g_planedetectorext_info,planeDetector_local);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    std::operator<<((ostream *)&oss,"Invalid XrPlaneDetectorEXT handle \"planeDetector\" ");
    HandleToHexString<XrPlaneDetectorEXT_T*>(in_stack_fffffffffffffdd8);
    std::operator<<((ostream *)&oss,(string *)&local_218);
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::string::string
              ((string *)&local_218,"VUID-xrDestroyPlaneDetectorEXT-planeDetector-parameter",
               (allocator *)&stack0xfffffffffffffddf);
    std::__cxx11::string::string
              ((string *)&local_1a0,"xrDestroyPlaneDetectorEXT",
               (allocator *)&stack0xfffffffffffffdde);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_1d8,&objects_info);
    std::__cxx11::stringbuf::str();
    CoreValidLogMessage((GenValidUsageXrInstanceInfo *)0x0,&local_218,
                        VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_1a0,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_1d8,&local_1c0);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
    ~_Vector_base(&local_1d8);
    std::__cxx11::string::~string((string *)&local_1a0);
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
    XVar2 = XR_ERROR_HANDLE_INVALID;
  }
  std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
  ~_Vector_base(&objects_info.
                 super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
               );
  return XVar2;
}

Assistant:

XrResult GenValidUsageInputsXrDestroyPlaneDetectorEXT(
XrPlaneDetectorEXT planeDetector) {
    try {
        XrResult xr_result = XR_SUCCESS;
        std::vector<GenValidUsageXrObjectInfo> objects_info;
        objects_info.emplace_back(planeDetector, XR_OBJECT_TYPE_PLANE_DETECTOR_EXT);

        {
            // writeValidateInlineHandleValidation
            ValidateXrHandleResult handle_result = VerifyXrPlaneDetectorEXTHandle(&planeDetector);
            if (handle_result != VALIDATE_XR_HANDLE_SUCCESS) {
                // Not a valid handle or NULL (which is not valid in this case)
                std::ostringstream oss;
                oss << "Invalid XrPlaneDetectorEXT handle \"planeDetector\" ";
                oss << HandleToHexString(planeDetector);
                CoreValidLogMessage(nullptr, "VUID-xrDestroyPlaneDetectorEXT-planeDetector-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrDestroyPlaneDetectorEXT",
                                    objects_info, oss.str());
                return XR_ERROR_HANDLE_INVALID;
            }
        }
        auto info_with_instance = g_planedetectorext_info.getWithInstanceInfo(planeDetector);
        GenValidUsageXrHandleInfo *gen_planedetectorext_info = info_with_instance.first;
        (void)gen_planedetectorext_info;  // quiet warnings
        GenValidUsageXrInstanceInfo *gen_instance_info = info_with_instance.second;
        (void)gen_instance_info;  // quiet warnings
        return xr_result;
    } catch (...) {
        return XR_ERROR_VALIDATION_FAILURE;
    }
}